

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

void register_subpage(uc_struct_conflict15 *uc,FlatView *fv,MemoryRegionSection *section)

{
  AddressSpaceDispatch *d;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint16_t uVar10;
  MemoryRegionSection *pMVar11;
  MemoryRegion *mr;
  MemoryRegionSection *extraout_RDX;
  MemoryRegionSection *section_00;
  MemoryRegionSection *extraout_RDX_00;
  long lVar12;
  long lVar13;
  int eidx;
  uint uVar14;
  ulong uVar15;
  int idx;
  uint uVar16;
  RAMBlock *addr;
  int iVar19;
  undefined1 auVar18 [16];
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar31;
  int iVar36;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar37;
  int iVar39;
  undefined1 auVar38 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar42 [16];
  PhysPageMap local_78;
  undefined8 local_58;
  RAMBlock *local_50;
  undefined1 local_48;
  ulong uVar17;
  
  d = (AddressSpaceDispatch *)(uc->address_space_memory).current_map;
  uVar1 = *(undefined8 *)(fv + 1);
  addr = (RAMBlock *)(ulong)((uint)uVar1 & 0xffffc000);
  pMVar11 = phys_page_find(d,(hwaddr)addr);
  local_78.nodes_nb = 0;
  local_78.nodes_nb_alloc = 0;
  local_78.sections_nb = 0x4000;
  local_78.sections_nb_alloc = 0;
  local_58 = 0;
  local_48 = 0;
  mr = pMVar11->mr;
  pMVar11 = extraout_RDX;
  local_50 = addr;
  if (mr->subpage == false) {
    if (mr != (MemoryRegion *)(*(long *)(*(long *)&fv->nr + 0x80) + 0x1d0)) {
      __assert_fail("existing->mr->subpage || existing->mr == &(section->mr->uc->io_mem_unassigned)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                    ,0x372,
                    "void register_subpage(struct uc_struct *, FlatView *, MemoryRegionSection *)");
    }
    mr = (MemoryRegion *)g_malloc0(0x80b0);
    *(uc_struct_conflict15 **)(mr + 1) = uc;
    mr[1].ram_block = addr;
    memory_region_init_io_tricore
              ((uc_struct_conflict15 *)
               (uc->address_space_memory).listeners.tqh_first[1].link.tqe_next,
               (MemoryRegion_conflict *)mr,&subpage_ops,mr,0x4000);
    mr->subpage = true;
    local_78.nodes = (Node *)mr;
    local_78.sections = (MemoryRegionSection *)uc;
    uVar10 = phys_section_add((uc_struct_conflict15 *)&d->map,&local_78,section_00);
    phys_page_set(d,(ulong)((uint)uVar1 >> 0xe),1,uVar10);
    pMVar11 = extraout_RDX_00;
  }
  if (fv->ranges == (FlatRange *)0x0) {
    uVar16 = (uint)*(undefined8 *)(fv + 1) & 0x3fff;
    uVar17 = (ulong)uVar16;
    lVar12 = *(long *)fv;
    uVar14 = (int)(lVar12 + uVar17) - 1;
    uVar10 = phys_section_add((uc_struct_conflict15 *)&d->map,(PhysPageMap *)fv,pMVar11);
    auVar9 = _DAT_00d58680;
    auVar8 = _DAT_00d58670;
    auVar7 = _DAT_00d58660;
    auVar6 = _DAT_00d58650;
    auVar5 = _DAT_00d58640;
    if (uVar16 <= uVar14 && uVar14 < 0x4000) {
      lVar12 = (lVar12 + uVar17 & 0xffffffff) - uVar17;
      lVar13 = lVar12 + -1;
      auVar18._8_4_ = (int)lVar13;
      auVar18._0_8_ = lVar13;
      auVar18._12_4_ = (int)((ulong)lVar13 >> 0x20);
      uVar15 = 0;
      auVar18 = auVar18 ^ _DAT_00d58680;
      do {
        auVar30._8_4_ = (int)uVar15;
        auVar30._0_8_ = uVar15;
        auVar30._12_4_ = (int)(uVar15 >> 0x20);
        auVar22 = (auVar30 | auVar8) ^ auVar9;
        iVar31 = auVar18._0_4_;
        iVar37 = -(uint)(iVar31 < auVar22._0_4_);
        iVar19 = auVar18._4_4_;
        auVar23._4_4_ = -(uint)(iVar19 < auVar22._4_4_);
        iVar36 = auVar18._8_4_;
        iVar39 = -(uint)(iVar36 < auVar22._8_4_);
        iVar20 = auVar18._12_4_;
        auVar23._12_4_ = -(uint)(iVar20 < auVar22._12_4_);
        auVar33._4_4_ = iVar37;
        auVar33._0_4_ = iVar37;
        auVar33._8_4_ = iVar39;
        auVar33._12_4_ = iVar39;
        auVar40 = pshuflw(in_XMM11,auVar33,0xe8);
        auVar25._4_4_ = -(uint)(auVar22._4_4_ == iVar19);
        auVar25._12_4_ = -(uint)(auVar22._12_4_ == iVar20);
        auVar25._0_4_ = auVar25._4_4_;
        auVar25._8_4_ = auVar25._12_4_;
        auVar42 = pshuflw(in_XMM12,auVar25,0xe8);
        auVar23._0_4_ = auVar23._4_4_;
        auVar23._8_4_ = auVar23._12_4_;
        auVar41 = pshuflw(auVar40,auVar23,0xe8);
        auVar22._8_4_ = 0xffffffff;
        auVar22._0_8_ = 0xffffffffffffffff;
        auVar22._12_4_ = 0xffffffff;
        auVar22 = (auVar41 | auVar42 & auVar40) ^ auVar22;
        auVar22 = packssdw(auVar22,auVar22);
        if ((auVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(uint16_t *)((long)&mr[1].ops + uVar15 * 2 + uVar17 * 2) = uVar10;
        }
        auVar23 = auVar25 & auVar33 | auVar23;
        auVar22 = packssdw(auVar23,auVar23);
        auVar41._8_4_ = 0xffffffff;
        auVar41._0_8_ = 0xffffffffffffffff;
        auVar41._12_4_ = 0xffffffff;
        auVar22 = packssdw(auVar22 ^ auVar41,auVar22 ^ auVar41);
        if ((auVar22._0_4_ >> 0x10 & 1) != 0) {
          *(uint16_t *)((long)&mr[1].ops + uVar15 * 2 + uVar17 * 2 + 2) = uVar10;
        }
        auVar22 = (auVar30 | auVar7) ^ auVar9;
        iVar37 = -(uint)(iVar31 < auVar22._0_4_);
        auVar38._4_4_ = -(uint)(iVar19 < auVar22._4_4_);
        iVar39 = -(uint)(iVar36 < auVar22._8_4_);
        auVar38._12_4_ = -(uint)(iVar20 < auVar22._12_4_);
        auVar24._4_4_ = iVar37;
        auVar24._0_4_ = iVar37;
        auVar24._8_4_ = iVar39;
        auVar24._12_4_ = iVar39;
        auVar32._4_4_ = -(uint)(auVar22._4_4_ == iVar19);
        auVar32._12_4_ = -(uint)(auVar22._12_4_ == iVar20);
        auVar32._0_4_ = auVar32._4_4_;
        auVar32._8_4_ = auVar32._12_4_;
        auVar38._0_4_ = auVar38._4_4_;
        auVar38._8_4_ = auVar38._12_4_;
        auVar22 = auVar32 & auVar24 | auVar38;
        auVar22 = packssdw(auVar22,auVar22);
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        auVar22 = packssdw(auVar22 ^ auVar2,auVar22 ^ auVar2);
        if ((auVar22 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(uint16_t *)((long)&mr[1].ops + uVar15 * 2 + uVar17 * 2 + 4) = uVar10;
        }
        auVar25 = pshufhw(auVar24,auVar24,0x84);
        auVar33 = pshufhw(auVar32,auVar32,0x84);
        auVar23 = pshufhw(auVar25,auVar38,0x84);
        auVar26._8_4_ = 0xffffffff;
        auVar26._0_8_ = 0xffffffffffffffff;
        auVar26._12_4_ = 0xffffffff;
        auVar26 = (auVar23 | auVar33 & auVar25) ^ auVar26;
        auVar25 = packssdw(auVar26,auVar26);
        if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(uint16_t *)((long)&mr[1].ops + uVar15 * 2 + uVar17 * 2 + 6) = uVar10;
        }
        auVar25 = (auVar30 | auVar6) ^ auVar9;
        iVar37 = -(uint)(iVar31 < auVar25._0_4_);
        auVar28._4_4_ = -(uint)(iVar19 < auVar25._4_4_);
        iVar39 = -(uint)(iVar36 < auVar25._8_4_);
        auVar28._12_4_ = -(uint)(iVar20 < auVar25._12_4_);
        auVar34._4_4_ = iVar37;
        auVar34._0_4_ = iVar37;
        auVar34._8_4_ = iVar39;
        auVar34._12_4_ = iVar39;
        auVar22 = pshuflw(auVar22,auVar34,0xe8);
        auVar27._4_4_ = -(uint)(auVar25._4_4_ == iVar19);
        auVar27._12_4_ = -(uint)(auVar25._12_4_ == iVar20);
        auVar27._0_4_ = auVar27._4_4_;
        auVar27._8_4_ = auVar27._12_4_;
        in_XMM12 = pshuflw(auVar42 & auVar40,auVar27,0xe8);
        in_XMM12 = in_XMM12 & auVar22;
        auVar28._0_4_ = auVar28._4_4_;
        auVar28._8_4_ = auVar28._12_4_;
        auVar22 = pshuflw(auVar22,auVar28,0xe8);
        auVar40._8_4_ = 0xffffffff;
        auVar40._0_8_ = 0xffffffffffffffff;
        auVar40._12_4_ = 0xffffffff;
        auVar40 = (auVar22 | in_XMM12) ^ auVar40;
        in_XMM11 = packssdw(auVar40,auVar40);
        if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(uint16_t *)((long)&mr[1].opaque + uVar15 * 2 + uVar17 * 2) = uVar10;
        }
        auVar28 = auVar27 & auVar34 | auVar28;
        auVar22 = packssdw(auVar28,auVar28);
        auVar42._8_4_ = 0xffffffff;
        auVar42._0_8_ = 0xffffffffffffffff;
        auVar42._12_4_ = 0xffffffff;
        auVar22 = packssdw(auVar22 ^ auVar42,auVar22 ^ auVar42);
        if ((auVar22 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(uint16_t *)((long)&mr[1].opaque + uVar15 * 2 + uVar17 * 2 + 2) = uVar10;
        }
        auVar22 = (auVar30 | auVar5) ^ auVar9;
        iVar31 = -(uint)(iVar31 < auVar22._0_4_);
        auVar35._4_4_ = -(uint)(iVar19 < auVar22._4_4_);
        iVar36 = -(uint)(iVar36 < auVar22._8_4_);
        auVar35._12_4_ = -(uint)(iVar20 < auVar22._12_4_);
        auVar29._4_4_ = iVar31;
        auVar29._0_4_ = iVar31;
        auVar29._8_4_ = iVar36;
        auVar29._12_4_ = iVar36;
        auVar21._4_4_ = -(uint)(auVar22._4_4_ == iVar19);
        auVar21._12_4_ = -(uint)(auVar22._12_4_ == iVar20);
        auVar21._0_4_ = auVar21._4_4_;
        auVar21._8_4_ = auVar21._12_4_;
        auVar35._0_4_ = auVar35._4_4_;
        auVar35._8_4_ = auVar35._12_4_;
        auVar22 = auVar21 & auVar29 | auVar35;
        auVar22 = packssdw(auVar22,auVar22);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar22 = packssdw(auVar22 ^ auVar3,auVar22 ^ auVar3);
        if ((auVar22 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(uint16_t *)((long)&mr[1].opaque + uVar15 * 2 + uVar17 * 2 + 4) = uVar10;
        }
        auVar30 = pshufhw(auVar29,auVar29,0x84);
        auVar22 = pshufhw(auVar21,auVar21,0x84);
        auVar25 = pshufhw(auVar30,auVar35,0x84);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar22 = packssdw(auVar22 & auVar30,(auVar25 | auVar22 & auVar30) ^ auVar4);
        if ((auVar22 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(uint16_t *)((long)&mr[1].opaque + uVar15 * 2 + uVar17 * 2 + 6) = uVar10;
        }
        uVar15 = uVar15 + 8;
      } while ((lVar12 + 7U & 0xfffffffffffffff8) != uVar15);
    }
    return;
  }
  __assert_fail("r == a",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                ,0x16,"uint64_t int128_get64(Int128)");
}

Assistant:

static void register_subpage(struct uc_struct *uc, FlatView *fv, MemoryRegionSection *section)
{
    AddressSpaceDispatch *d = flatview_to_dispatch(fv);
    subpage_t *subpage;
    hwaddr base = section->offset_within_address_space
        & TARGET_PAGE_MASK;
    MemoryRegionSection *existing = phys_page_find(d, base);
    MemoryRegionSection subsection = {
        .offset_within_address_space = base,
        .size = int128_make64(TARGET_PAGE_SIZE),
    };
    hwaddr start, end;

    assert(existing->mr->subpage || existing->mr == &(section->mr->uc->io_mem_unassigned));

    if (!(existing->mr->subpage)) {
        subpage = subpage_init(uc, fv, base);
        subsection.fv = fv;
        subsection.mr = &subpage->iomem;
        phys_page_set(d, base >> TARGET_PAGE_BITS, 1,
                      phys_section_add(uc, &d->map, &subsection));
    } else {
        subpage = container_of(existing->mr, subpage_t, iomem);
    }
    start = section->offset_within_address_space & ~TARGET_PAGE_MASK;
    end = start + int128_get64(section->size) - 1;
    subpage_register(uc, subpage, start, end,
                     phys_section_add(uc, &d->map, section));
}